

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
Clasp::DimacsReader::parseAtLeastK(DimacsReader *this,WeightLitVec *scratch,int64_t maxV)

{
  int iVar1;
  bool bVar2;
  BufferedStream *pBVar3;
  bool cnd;
  int64 lit;
  pair<Clasp::Literal,_int> local_48;
  int64_t local_40;
  int64 k;
  
  (scratch->ebo_).size = 0;
  pBVar3 = Potassco::ProgramReader::stream((ProgramReader *)this);
  bVar2 = Potassco::BufferedStream::match(pBVar3,&k,false);
  Potassco::ProgramReader::require
            ((ProgramReader *)this,CONCAT44(k._4_4_,(weight_t)k) >> 0x1f == 0 && bVar2,
             "invalid at-least-k constraint");
  local_40 = maxV;
  while( true ) {
    pBVar3 = Potassco::ProgramReader::stream((ProgramReader *)this);
    cnd = false;
    bVar2 = Potassco::BufferedStream::match(pBVar3,&lit,false);
    if (bVar2) {
      cnd = lit <= local_40 && SBORROW8(lit,-maxV) == lit + maxV < 0;
    }
    Potassco::ProgramReader::require
              ((ProgramReader *)this,cnd,"invalid variable in at-least-k constraint");
    if (lit == 0) break;
    iVar1 = (int)lit;
    local_48.first.rep_ = iVar1 * -4 + 2;
    if (-1 < iVar1) {
      local_48.first.rep_ = iVar1 * 4;
    }
    local_48.second = 1;
    bk_lib::
    pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
    push_back(scratch,&local_48);
  }
  SatBuilder::addConstraint(this->program_,scratch,(weight_t)k);
  return;
}

Assistant:

void DimacsReader::parseAtLeastK(WeightLitVec& scratch, int64_t maxV) {
	scratch.clear();
	int64 k;
	require(stream()->match(k) && k >= 0 && k <= CLASP_WEIGHT_T_MAX, "invalid at-least-k constraint");
	for (int64 lit;;) {
		require(stream()->match(lit) && lit >= -maxV && lit <= maxV, "invalid variable in at-least-k constraint");
		if (lit == 0) {
			program_->addConstraint(scratch, static_cast<weight_t>(k));
			return;
		}
		scratch.push_back(WeightLiteral(toLit(static_cast<int32>(lit)), 1));
	}
}